

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_param_tests3.cpp
# Opt level: O0

void __thiscall iutest_typed_test_suite_p_name_TypeParamTest3_::Mul2<short>::Body(Mul2<short> *this)

{
  bool bVar1;
  char *message;
  AssertionHelper local_210;
  Fixed local_1d0;
  int local_48;
  int local_44;
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  TypeParam_conflict4 x;
  Mul2<short> *this_local;
  
  iutest_ar._38_2_ = 1;
  iutest::detail::AlwaysZero();
  local_44 = (int)(short)iutest_ar._38_2_ + (int)(short)iutest_ar._38_2_;
  local_48 = (int)(short)iutest_ar._38_2_ << 1;
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_40,"x+x","2*x",&local_44,&local_48);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1d0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d0);
    message = iutest::AssertionResult::message((AssertionResult *)local_40);
    iutest::AssertionHelper::AssertionHelper
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/type_param_tests3.cpp"
               ,0x27,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_210,&local_1d0);
    iutest::AssertionHelper::~AssertionHelper(&local_210);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  return;
}

Assistant:

IUTEST_TYPED_TEST_P(TypeParamTest3, Mul2)
{
    TypeParam x = 1;
    IUTEST_ASSERT_EQ(x+x, 2*x);
}